

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O0

void __thiscall Unit::set(Unit *this,int s,int kg,int m,int p,int c,int cd,int ph)

{
  int c_local;
  int p_local;
  int m_local;
  int kg_local;
  int s_local;
  Unit *this_local;
  
  this->siUnits[0] = s;
  this->siUnits[1] = kg;
  this->siUnits[2] = m;
  this->siUnits[3] = p;
  this->siUnits[4] = c;
  this->siUnits[5] = cd;
  this->siUnits[6] = ph;
  setNames(this);
  return;
}

Assistant:

void Unit::set(int s, int kg, int m, int p, int c, int cd, int ph)
{
	siUnits[0] = s;
	siUnits[1] = kg;
	siUnits[2] = m;
	siUnits[3] = p;
	siUnits[4] = c;
	siUnits[5] = cd;
	siUnits[6] = ph;
	setNames();
}